

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacWriteBlif.c
# Opt level: O2

void Psr_ManWriteBlifArray(FILE *pFile,Psr_Ntk_t *p,Vec_Int_t *vFanins)

{
  int h;
  char *pcVar1;
  int i;
  
  for (i = 0; i < vFanins->nSize; i = i + 1) {
    h = Vec_IntEntry(vFanins,i);
    pcVar1 = Psr_NtkStr(p,h);
    fprintf((FILE *)pFile," %s",pcVar1);
  }
  fputc(10,(FILE *)pFile);
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Writing parser state into a file.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
static void Psr_ManWriteBlifArray( FILE * pFile, Psr_Ntk_t * p, Vec_Int_t * vFanins )
{
    int i, NameId;
    Vec_IntForEachEntry( vFanins, NameId, i )
        fprintf( pFile, " %s", Psr_NtkStr(p, NameId) );
    fprintf( pFile, "\n" );
}